

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_iterator.cpp
# Opt level: O2

void duckdb::ExpressionIterator::EnumerateChildren
               (Expression *expr,function<void_(duckdb::Expression_&)> *callback)

{
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._8_8_ = 0;
  local_10 = ::std::
             _Function_handler<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/planner/expression_iterator.cpp:20:26)>
             ::_M_invoke;
  local_18 = ::std::
             _Function_handler<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/planner/expression_iterator.cpp:20:26)>
             ::_M_manager;
  local_28._M_unused._M_object = callback;
  EnumerateChildren(expr,(function<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_&)>
                          *)&local_28);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return;
}

Assistant:

void ExpressionIterator::EnumerateChildren(Expression &expr, const std::function<void(Expression &child)> &callback) {
	EnumerateChildren(expr, [&](unique_ptr<Expression> &child) { callback(*child); });
}